

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::convertArray(HlslParseContext *this,TIntermTyped *node,TType *type)

{
  TIntermediate *pTVar1;
  int iVar2;
  int iVar3;
  TBasicType t;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar5;
  TIntermAggregate *node_00;
  undefined4 extraout_var_03;
  TType *type_00;
  TIntermTyped *constructee;
  int constructeeComponent;
  int constructeeElement;
  anon_class_40_5_95b64da4 getNextComponent;
  TType crossType;
  TType derefType;
  TType speculativeComponentType;
  TIntermAggregate *local_248;
  TIntermTyped *local_240;
  int local_238;
  TOperator local_234;
  TIntermTyped *local_230;
  int local_228 [2];
  anon_class_40_5_95b64da4 local_220;
  TType local_1f8;
  TType local_160;
  TType local_c8;
  
  local_240 = node;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(node);
  if (((char)iVar2 == '\0') || (iVar2 = (*type->_vptr_TType[0x1d])(type), (char)iVar2 == '\0')) {
    __assert_fail("node->isArray() && type.isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x21f3,
                  "TIntermTyped *glslang::HlslParseContext::convertArray(TIntermTyped *, const TType &)"
                 );
  }
  iVar2 = (*(local_240->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar2 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar2));
  iVar3 = TType::computeNumComponents(type);
  local_248 = (TIntermAggregate *)0x0;
  if (iVar3 <= iVar2) {
    iVar2 = (*(local_240->super_TIntermNode)._vptr_TIntermNode[3])();
    local_230 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
    local_220.constructee = &local_230;
    local_220.constructeeElement = local_228 + 1;
    local_228[1] = 0;
    local_220.constructeeComponent = local_228;
    local_228[0] = 0;
    local_220.this = this;
    local_220.node = &local_240;
    TType::TType(&local_160,type,0,false);
    TType::TType(&local_c8,&local_160,0,false);
    type_00 = &local_c8;
    if ((local_160._8_4_ & 0x100e00) == 0) {
      type_00 = &local_160;
    }
    iVar2 = 0;
    local_234 = TIntermediate::mapTypeToConstructorOp
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,type_00
                          );
    t = (*(local_240->super_TIntermNode)._vptr_TIntermNode[0x20])();
    iVar3 = (*type->_vptr_TType[0xc])(type);
    TType::TType(&local_1f8,t,EvqTemporary,iVar3,0,0,false);
    iVar3 = (*type->_vptr_TType[0xf])(type);
    if (iVar3 < 1) {
LAB_00420443:
      local_248 = (TIntermAggregate *)0x0;
    }
    else {
      local_248 = (TIntermAggregate *)0x0;
      do {
        iVar3 = (*type->_vptr_TType[0xc])(type);
        iVar4 = (*(local_230->super_TIntermNode)._vptr_TIntermNode[0x26])();
        if (iVar3 == iVar4) {
          iVar3 = (**(local_240->super_TIntermNode)._vptr_TIntermNode)();
          pTVar5 = local_230;
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (**(local_240->super_TIntermNode)._vptr_TIntermNode)();
          index = TIntermediate::addConstantUnion
                            (pTVar1,iVar2,(TSourceLoc *)CONCAT44(extraout_var_02,iVar4),false);
          pTVar5 = handleBracketDereference
                             (this,(TSourceLoc *)CONCAT44(extraout_var_01,iVar3),pTVar5,
                              &index->super_TIntermTyped);
        }
        else {
          iVar3 = (*type->_vptr_TType[0xc])(type);
          if (iVar3 == 1) {
            pTVar5 = convertArray::anon_class_40_5_95b64da4::operator()(&local_220);
          }
          else {
            local_238 = iVar2;
            iVar2 = (*type->_vptr_TType[0xc])(type);
            if (iVar2 < 1) {
              node_00 = (TIntermAggregate *)0x0;
            }
            else {
              iVar2 = 0;
              node_00 = (TIntermAggregate *)0x0;
              do {
                pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                pTVar5 = convertArray::anon_class_40_5_95b64da4::operator()(&local_220);
                node_00 = TIntermediate::growAggregate
                                    (pTVar1,(TIntermNode *)node_00,&pTVar5->super_TIntermNode);
                iVar2 = iVar2 + 1;
                iVar3 = (*type->_vptr_TType[0xc])(type);
              } while (iVar2 < iVar3);
            }
            iVar2 = (**(local_240->super_TIntermNode)._vptr_TIntermNode)();
            pTVar5 = addConstructor(this,(TSourceLoc *)CONCAT44(extraout_var_03,iVar2),
                                    (TIntermTyped *)node_00,&local_1f8);
            iVar2 = local_238;
          }
        }
        pTVar5 = TIntermediate::addConversion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            local_234,&local_160,pTVar5);
        if (pTVar5 == (TIntermTyped *)0x0) goto LAB_00420443;
        local_248 = TIntermediate::growAggregate
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TIntermNode *)local_248,&pTVar5->super_TIntermNode);
        iVar2 = iVar2 + 1;
        iVar3 = (*type->_vptr_TType[0xf])(type);
      } while (iVar2 < iVar3);
    }
  }
  return (TIntermTyped *)local_248;
}

Assistant:

TIntermTyped* HlslParseContext::convertArray(TIntermTyped* node, const TType& type)
{
    assert(node->isArray() && type.isArray());
    if (node->getType().computeNumComponents() < type.computeNumComponents())
        return nullptr;

    // TODO: write an argument replicator, for the case the argument should not be
    // executed multiple times, yet multiple copies are needed.

    TIntermTyped* constructee = node->getAsTyped();
    // track where we are in consuming the argument
    int constructeeElement = 0;
    int constructeeComponent = 0;

    // bump up to the next component to consume
    const auto getNextComponent = [&]() {
        TIntermTyped* component;
        component = handleBracketDereference(node->getLoc(), constructee,
                                             intermediate.addConstantUnion(constructeeElement, node->getLoc()));
        if (component->isVector())
            component = handleBracketDereference(node->getLoc(), component,
                                                 intermediate.addConstantUnion(constructeeComponent, node->getLoc()));
        // bump component pointer up
        ++constructeeComponent;
        if (constructeeComponent == constructee->getVectorSize()) {
            constructeeComponent = 0;
            ++constructeeElement;
        }
        return component;
    };

    // make one subnode per constructed array element
    TIntermAggregate* constructor = nullptr;
    TType derefType(type, 0);
    TType speculativeComponentType(derefType, 0);
    TType* componentType = derefType.isVector() ? &speculativeComponentType : &derefType;
    TOperator componentOp = intermediate.mapTypeToConstructorOp(*componentType);
    TType crossType(node->getBasicType(), EvqTemporary, type.getVectorSize());
    for (int e = 0; e < type.getOuterArraySize(); ++e) {
        // construct an element
        TIntermTyped* elementArg;
        if (type.getVectorSize() == constructee->getVectorSize()) {
            // same element shape
            elementArg = handleBracketDereference(node->getLoc(), constructee,
                                                  intermediate.addConstantUnion(e, node->getLoc()));
        } else {
            // mismatched element shapes
            if (type.getVectorSize() == 1)
                elementArg = getNextComponent();
            else {
                // make a vector
                TIntermAggregate* elementConstructee = nullptr;
                for (int c = 0; c < type.getVectorSize(); ++c)
                    elementConstructee = intermediate.growAggregate(elementConstructee, getNextComponent());
                elementArg = addConstructor(node->getLoc(), elementConstructee, crossType);
            }
        }
        // convert basic types
        elementArg = intermediate.addConversion(componentOp, derefType, elementArg);
        if (elementArg == nullptr)
            return nullptr;
        // combine with top-level constructor
        constructor = intermediate.growAggregate(constructor, elementArg);
    }

    return constructor;
}